

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_26ba73::PulseMainloop::waitForOperation
          (PulseMainloop *this,pa_operation *op,unique_lock<std::mutex> *plock)

{
  int iVar1;
  
  if (op != (pa_operation *)0x0) {
    while( true ) {
      iVar1 = (*(anonymous_namespace)::ppa_operation_get_state)(op);
      if (iVar1 != 0) break;
      std::condition_variable::wait((unique_lock *)&this->mCondVar);
    }
    (*(anonymous_namespace)::ppa_operation_unref)(op);
    return;
  }
  return;
}

Assistant:

void waitForOperation(pa_operation *op, std::unique_lock<std::mutex> &plock)
    {
        if(op)
        {
            mCondVar.wait(plock,
                [op]() -> bool { return pa_operation_get_state(op) != PA_OPERATION_RUNNING; });
            pa_operation_unref(op);
        }
    }